

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int ReadFileToCStringsList(CStringsList **f,char *end)

{
  int iVar1;
  CStringsList *this;
  char *local_38;
  char *p;
  CStringsList **ppCStack_28;
  bool SplitByColon;
  CStringsList **s;
  char *end_local;
  CStringsList **f_local;
  
  p._7_1_ = 1;
  ppCStack_28 = f;
  s = (CStringsList **)end;
  end_local = (char *)f;
  while( true ) {
    iVar1 = ReadLineNoMacro((bool)(p._7_1_ & 1));
    if (iVar1 == 0) {
      return 0;
    }
    CompiledCurrentLine = CompiledCurrentLine + 1;
    local_38 = line;
    SkipBlanks(&local_38);
    if (*local_38 == '.') {
      local_38 = local_38 + 1;
    }
    iVar1 = cmphstr(&local_38,(char *)s,false);
    if (iVar1 != 0) break;
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,line,(CStringsList *)0x0);
    *ppCStack_28 = this;
    ppCStack_28 = &(*ppCStack_28)->next;
    ListFile(true);
    if (((p._7_1_ & 1) == 0) || (iVar1 = cmphstr(&local_38,"lua",false), iVar1 == 0)) {
      if (((p._7_1_ & 1) == 0) && (iVar1 = cmphstr(&local_38,"endlua",false), iVar1 != 0)) {
        p._7_1_ = 1;
      }
    }
    else {
      p._7_1_ = 0;
    }
  }
  lp = ReplaceDefine(local_38);
  return 1;
}

Assistant:

int ReadFileToCStringsList(CStringsList*& f, const char* end) {
	// f itself should be already NULL, not resetting it here
	CStringsList** s = &f;
	bool SplitByColon = true;
	while (ReadLineNoMacro(SplitByColon)) {
		++CompiledCurrentLine;
		char* p = line;
		SkipBlanks(p);
		if ('.' == *p) ++p;
		if (cmphstr(p, end)) {		// finished, read rest after end marker into line buffers
			lp = ReplaceDefine(p);
			return 1;
		}
		*s = new CStringsList(line);
		s = &((*s)->next);
		ListFile(true);
		// Try to ignore colons inside lua blocks... this is far from bulletproof, but should improve it
		if (SplitByColon && cmphstr(p, "lua")) {
			SplitByColon = false;
		} else if (!SplitByColon && cmphstr(p, "endlua")) {
			SplitByColon = true;
		}
	}
	return 0;
}